

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

int Mf_CutRef2_rec(Mf_Man_t *p,int *pCut,Vec_Int_t *vTemp,int Limit)

{
  Jf_Par_t *pJVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  uVar2 = *pCut & 0x1f;
  iVar5 = 0;
  if (1 < uVar2) {
    pJVar1 = p->pPars;
    if (pJVar1->fGenCnf == 0) {
      if (pJVar1->fOptEdge == 0) {
        iVar5 = 1;
      }
      else {
        iVar5 = pJVar1->nAreaTuner + uVar2;
      }
    }
    else {
      uVar4 = (uint)*pCut >> 6;
      if ((p->vCnfSizes).nSize <= (int)uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = (p->vCnfSizes).pArray[uVar4];
    }
  }
  if (uVar2 != 0 && Limit != 0) {
    uVar6 = 0;
    do {
      Vec_IntPush(vTemp,pCut[uVar6 + 1]);
      uVar2 = *(uint *)&p->pLfObjs[pCut[uVar6 + 1]].field_0xc;
      *(short *)&p->pLfObjs[pCut[uVar6 + 1]].field_0xe =
           (short)((uVar2 & 0xffff0000) + 0x10000 >> 0x10);
      if ((uVar2 < 0x10000) && (iVar3 = p->pLfObjs[pCut[uVar6 + 1]].iCutSet, iVar3 != 0)) {
        uVar2 = iVar3 >> 0x10;
        if (((int)uVar2 < 0) || ((p->vPages).nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        iVar3 = Mf_CutRef2_rec(p,(int *)((long)(p->vPages).pArray[uVar2] +
                                        (ulong)(ushort)iVar3 * 4 + 4),vTemp,Limit + -1);
        iVar5 = iVar5 + iVar3;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (*pCut & 0x1f));
  }
  return iVar5;
}

Assistant:

int Mf_CutRef2_rec( Mf_Man_t * p, int * pCut, Vec_Int_t * vTemp, int Limit )
{
    int i, Count = Mf_CutArea(p, Mf_CutSize(pCut), Mf_CutFunc(pCut));
    if ( Limit == 0 ) return Count;
    for ( i = 1; i <= Mf_CutSize(pCut); i++ )
    {
        Vec_IntPush( vTemp, pCut[i] );
        if ( !Mf_ObjMapRefInc(p, pCut[i]) && Mf_ManObj(p, pCut[i])->iCutSet )
            Count += Mf_CutRef2_rec( p, Mf_ObjCutBest(p, pCut[i]), vTemp, Limit-1 );
    }
    return Count;
}